

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FileWatcher.cpp
# Opt level: O2

WatchID __thiscall
efsw::FileWatcher::addWatch
          (FileWatcher *this,string *directory,FileWatchListener *watcher,bool recursive,
          vector<efsw::WatcherOption,_std::allocator<efsw::WatcherOption>_> *options)

{
  bool bVar1;
  Error EVar2;
  int iVar3;
  undefined4 extraout_var;
  FileWatcherImpl *pFVar4;
  string sStack_48;
  
  pFVar4 = this->mImpl;
  if (pFVar4->mIsGeneric == false) {
    bVar1 = FileSystem::isRemoteFS(directory);
    if (bVar1) {
      std::__cxx11::string::string((string *)&sStack_48,(string *)directory);
      EVar2 = Errors::Log::createLastError(FileRemote,&sStack_48);
      std::__cxx11::string::~string((string *)&sStack_48);
      return (long)EVar2;
    }
    pFVar4 = this->mImpl;
  }
  iVar3 = (*pFVar4->_vptr_FileWatcherImpl[2])(pFVar4,directory,watcher,(ulong)recursive,options);
  return CONCAT44(extraout_var,iVar3);
}

Assistant:

WatchID FileWatcher::addWatch( const std::string& directory, FileWatchListener* watcher,
							   bool recursive, const std::vector<WatcherOption>& options ) {
	if ( mImpl->mIsGeneric || !FileSystem::isRemoteFS( directory ) ) {
		return mImpl->addWatch( directory, watcher, recursive, options );
	} else {
		return Errors::Log::createLastError( Errors::FileRemote, directory );
	}
}